

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O3

void __thiscall PeleLM::state_stats(PeleLM *this,MultiFab *S)

{
  ostringstream *poVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  initializer_list<const_amrex::MultiFab_*> __l;
  initializer_list<const_amrex::MultiFab_*> __l_00;
  Vector<double,_std::allocator<double>_> scaleMin;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  Vector<double,_std::allocator<double>_> scaleMax;
  allocator_type local_211;
  Vector<double,_std::allocator<double>_> local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  Vector<double,_std::allocator<double>_> local_1d8;
  double local_1c0;
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [46];
  
  if (1 < NavierStokesBase::verbose) {
    __l._M_len = 1;
    __l._M_array = (iterator)&local_1d8;
    local_1d8.super_vector<double,_std::allocator<double>_>.
    super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)S;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_1b8,__l,(allocator_type *)&local_1f8);
    amrex::VectorMin(&local_210,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     local_1b8,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    pvVar2 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,local_1b8._16_8_ - (long)pvVar2);
    }
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&local_1f8;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)S;
    std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               local_1b8,__l_00,&local_211);
    amrex::VectorMax(&local_1d8,
                     (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
                     local_1b8,(IntVect *)&amrex::FabArrayBase::mfiter_tile_size,3,
                     NavierStokesBase::NUM_STATE + -3,0);
    pvVar2 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
    if (pvVar2 != (void *)0x0) {
      operator_delete(pvVar2,local_1b8._16_8_ - (long)pvVar2);
    }
    uVar4 = 0;
    do {
      local_1c0 = local_210.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[(long)first_spec + (uVar4 - 3)];
      if (0x13 < uVar4) break;
      uVar4 = uVar4 + 1;
    } while (0.0 <= local_1c0);
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1a0 + (long)*(pointer)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"      |-> Min,max temp = ",0x19);
    std::ostream::_M_insert<double>
              (local_210.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)NavierStokesBase::Temp + -3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<double>
              (*(double *)
                ((long)local_1d8.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)NavierStokesBase::Temp * 8 + -0x18))
    ;
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    amrex::Print::~Print((Print *)local_1b8);
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1a0 + (long)*(pointer)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"      |-> Min,max rho  = ",0x19);
    std::ostream::_M_insert<double>
              (*local_210.super_vector<double,_std::allocator<double>_>.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<double>
              ((double)(((FabArray<amrex::FArrayBox> *)
                        local_1d8.super_vector<double,_std::allocator<double>_>.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_FabArrayBase)._vptr_FabArrayBase);
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_1_ = (allocator_type)0xa;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    amrex::Print::~Print((Print *)local_1b8);
    local_1b8._8_8_ = amrex::OutStream();
    local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
    poVar1 = (ostringstream *)(local_1b8 + 0x10);
    local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    *(undefined8 *)((long)auStack_1a0 + (long)*(pointer)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"      |-> Min,max rhoh = ",0x19);
    std::ostream::_M_insert<double>
              (local_210.super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[(long)RhoH + -3]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", ",2);
    std::ostream::_M_insert<double>
              (*(double *)
                ((long)local_1d8.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start + (long)RhoH * 8 + -0x18));
    local_1f8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,(char *)&local_1f8,1);
    amrex::Print::~Print((Print *)local_1b8);
    if (local_1c0 < 0.0) {
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
                ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&local_1f8);
      local_1b8._8_8_ = amrex::OutStream();
      local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
      local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
      *(undefined8 *)((long)auStack_1a0 + (long)*(pointer)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),"  Species w/min < 0: ",0x15);
      amrex::Print::~Print((Print *)local_1b8);
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      iVar5 = -3;
      lVar6 = 8;
      iVar3 = first_spec;
      do {
        if (local_210.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3 + iVar5] <= 0.0 &&
            local_210.super_vector<double,_std::allocator<double>_>.
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar3 + iVar5] != 0.0) {
          local_1b8._8_8_ = amrex::OutStream();
          local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
          local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          *(undefined8 *)((long)auStack_1a0 + (long)*(pointer)(local_1b8._16_8_ + -0x18)) =
               *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Y(",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     *(char **)((long)local_1f8.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar6 + -8),
                     *(long *)((long)&((local_1f8.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") [",3);
          std::ostream::_M_insert<double>
                    (local_210.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar3 + iVar5]);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]  ",3);
          amrex::Print::~Print((Print *)local_1b8);
          iVar3 = first_spec;
        }
        iVar5 = iVar5 + 1;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0x2a8);
      local_1b8._8_8_ = amrex::OutStream();
      local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
      local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b8 + 0x10));
      *(undefined8 *)((long)auStack_1a0 + (long)*(pointer)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8._8_8_ + *(long *)(*(long *)local_1b8._8_8_ + -0x18) + 8);
      local_211 = (allocator_type)0xa;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1b8 + 0x10),(char *)&local_211,1);
      amrex::Print::~Print((Print *)local_1b8);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1f8);
    }
    if ((MultiFab *)
        local_1d8.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != (MultiFab *)0x0) {
      operator_delete(local_1d8.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d8.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_210.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
        != (double *)0x0) {
      operator_delete(local_210.super_vector<double,_std::allocator<double>_>.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_210.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void
PeleLM::state_stats (MultiFab& S)
{
   BL_PROFILE("PLM::state_stats()");
   if (verbose > 1) {
      //
      // Calculate some minimums and maximums.
      //
      auto scaleMin = VectorMin({&S},FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMax = VectorMax({&S},FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);

      bool aNegY = false;
      for (int i = 0; i < NUM_SPECIES && !aNegY; ++i) {
         if (scaleMin[first_spec+i-AMREX_SPACEDIM] < 0) aNegY = true;
      }

      amrex::Print() << "      |-> Min,max temp = " << scaleMin[Temp   - AMREX_SPACEDIM]
                     << ", "                << scaleMax[Temp   - AMREX_SPACEDIM] << '\n';
      amrex::Print() << "      |-> Min,max rho  = " << scaleMin[Density- AMREX_SPACEDIM]
                     << ", "                << scaleMax[Density- AMREX_SPACEDIM] << '\n';
      amrex::Print() << "      |-> Min,max rhoh = " << scaleMin[RhoH   - AMREX_SPACEDIM]
                     << ", "                << scaleMax[RhoH   - AMREX_SPACEDIM] << '\n';

      if (aNegY){
         Vector<std::string> names;
         pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);
         amrex::Print() << "  Species w/min < 0: ";
         for (int i = 0; i < NUM_SPECIES; ++i) {
            int idx = first_spec + i - AMREX_SPACEDIM;
            if ( scaleMin[idx] < 0) {
               amrex::Print() << "Y(" << names[i] << ") [" << scaleMin[idx] << "]  ";
            }
         }
         amrex::Print() << '\n';
      }
   }
}